

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int wall_angle(rm *loc)

{
  byte bVar1;
  uint uVar2;
  int local_28;
  int local_24;
  int idx;
  int col;
  int *row;
  uint seenv;
  rm *loc_local;
  
  bVar1 = loc->seenv;
  switch(loc->typ) {
  case '\x01':
switchD_0018de72_caseD_1:
    uVar2 = *(uint *)&loc->field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      if (bVar1 == 0) {
        return 1;
      }
      return 2;
    }
    if (uVar2 == 1) {
      if ((bVar1 & 0x3e) == 0) {
        return 1;
      }
      return 2;
    }
    if (uVar2 != 2) {
      impossible("wall_angle: unknown vwall mode %d",(ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      return 1;
    }
    if ((bVar1 & 0xe3) == 0) {
      return 1;
    }
    return 2;
  case '\x02':
    goto LAB_0018e21d;
  case '\x03':
    uVar2 = *(uint *)&loc->field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      local_28 = 4;
    }
    else if (uVar2 == 1) {
      local_28 = 1;
      if ((bVar1 & 0x38) != 0) {
        local_28 = 4;
      }
    }
    else if (uVar2 == 2) {
      local_28 = 1;
      if ((bVar1 & 0xef) != 0) {
        local_28 = 4;
      }
    }
    else {
      impossible("wall_angle: unknown %s mode %d","tlcorn",
                 (ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      local_28 = 1;
    }
    break;
  case '\x04':
    uVar2 = *(uint *)&loc->field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      local_28 = 5;
    }
    else if (uVar2 == 1) {
      local_28 = 1;
      if ((bVar1 & 0xe0) != 0) {
        local_28 = 5;
      }
    }
    else if (uVar2 == 2) {
      local_28 = 1;
      if ((bVar1 & 0xbf) != 0) {
        local_28 = 5;
      }
    }
    else {
      impossible("wall_angle: unknown %s mode %d","trcorn",
                 (ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      local_28 = 1;
    }
    break;
  case '\x05':
    uVar2 = *(uint *)&loc->field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      local_28 = 6;
    }
    else if (uVar2 == 1) {
      local_28 = 1;
      if ((bVar1 & 0xe) != 0) {
        local_28 = 6;
      }
    }
    else if (uVar2 == 2) {
      local_28 = 1;
      if ((bVar1 & 0xfb) != 0) {
        local_28 = 6;
      }
    }
    else {
      impossible("wall_angle: unknown %s mode %d","blcorn",
                 (ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      local_28 = 1;
    }
    break;
  case '\x06':
    uVar2 = *(uint *)&loc->field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      local_28 = 7;
    }
    else if (uVar2 == 1) {
      local_28 = 1;
      if ((bVar1 & 0x83) != 0) {
        local_28 = 7;
      }
    }
    else if (uVar2 == 2) {
      local_28 = 1;
      if ((bVar1 & 0xfe) != 0) {
        local_28 = 7;
      }
    }
    else {
      impossible("wall_angle: unknown %s mode %d","brcorn",
                 (ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      local_28 = 1;
    }
    break;
  case '\a':
    switch(*(uint *)&loc->field_0x6 >> 4 & 7) {
    case 0:
      if (bVar1 == 1) {
        return 7;
      }
      if (bVar1 == 4) {
        return 6;
      }
      if (bVar1 == 0x10) {
        return 4;
      }
      if (bVar1 == 0x40) {
        return 5;
      }
      if (((bVar1 & 0xf8) == 0) && (((bVar1 & 2) != 0 || (bVar1 == 5)))) {
        return 9;
      }
      if (((bVar1 & 0xe3) == 0) && (((bVar1 & 8) != 0 || (bVar1 == 0x14)))) {
        return 0xc;
      }
      if (((bVar1 & 0x8f) == 0) && (((bVar1 & 0x20) != 0 || (bVar1 == 0x50)))) {
        return 10;
      }
      if (((bVar1 & 0x3e) == 0) && (((bVar1 & 0x80) != 0 || (bVar1 == 0x41)))) {
        return 0xb;
      }
      return 8;
    case 1:
      _idx = (int (*) [6])0x3608c8;
      bVar1 = bVar1 >> 4 | bVar1 << 4;
      break;
    case 2:
      _idx = (int (*) [6])0x3608e0;
      bVar1 = bVar1 >> 6 | bVar1 << 2;
      break;
    case 3:
      _idx = cross_matrix;
      bVar1 = bVar1 >> 2 | bVar1 << 6;
      break;
    case 4:
      _idx = (int (*) [6])0x3608f8;
      break;
    case 5:
      if (((bVar1 & 0xe) != 0) && ((bVar1 & 0xf1) == 0)) {
        return 6;
      }
      if (((bVar1 & 0xe0) != 0) && ((bVar1 & 0x1f) == 0)) {
        return 5;
      }
      if (((bVar1 & 0x11) != 0) && ((bVar1 & 0xee) == 0)) {
        return 1;
      }
      return 8;
    case 6:
      if (((bVar1 & 0x83) != 0) && ((bVar1 & 0x7c) == 0)) {
        return 7;
      }
      if (((bVar1 & 0x38) != 0) && ((bVar1 & 199) == 0)) {
        return 4;
      }
      if (((bVar1 & 0x44) != 0) && ((bVar1 & 0xbb) == 0)) {
        return 1;
      }
      return 8;
    default:
      impossible("wall_angle: unknown crosswall mode");
      return 1;
    }
    if (bVar1 == 0x10) {
      local_28 = 1;
    }
    else {
      if ((bVar1 & 0xef) == 1) {
        local_24 = 1;
      }
      else if ((bVar1 & 0xc) == 0) {
        if ((bVar1 & 0x60) == 0) {
          if ((bVar1 & 2) == 0) {
            if ((bVar1 & 0x80) == 0) {
              impossible("wall_angle: bottom of crwall check");
              local_24 = 5;
            }
            else {
              local_24 = 3;
              if ((bVar1 & 2) != 0) {
                local_24 = 5;
              }
            }
          }
          else {
            local_24 = 4;
            if ((bVar1 & 0x80) != 0) {
              local_24 = 5;
            }
          }
        }
        else if ((bVar1 & 0xe) == 0) {
          if ((bVar1 & 0x81) == 0) {
            local_24 = 0;
          }
          else {
            local_24 = 3;
          }
        }
        else {
          local_24 = 5;
        }
      }
      else if ((bVar1 & 0xe0) == 0) {
        if ((bVar1 & 3) == 0) {
          local_24 = 2;
        }
        else {
          local_24 = 4;
        }
      }
      else {
        local_24 = 5;
      }
      local_28 = (*_idx)[local_24];
    }
    break;
  case '\b':
    _idx = (int (*) [6])0x360888;
    bVar1 = bVar1 >> 4 | bVar1 << 4;
    goto LAB_0018def4;
  case '\t':
    _idx = (int (*) [6])wall_matrix;
    goto LAB_0018def4;
  case '\n':
    _idx = (int (*) [6])0x360874;
    bVar1 = bVar1 >> 2 | bVar1 << 6;
    goto LAB_0018def4;
  case '\v':
    _idx = (int (*) [6])0x36089c;
    bVar1 = bVar1 >> 6 | bVar1 << 2;
LAB_0018def4:
    switch(*(uint *)&loc->field_0x6 >> 4 & 7) {
    case 0:
      if (bVar1 == 0x10) {
        local_24 = 1;
      }
      else if (bVar1 == 0x40) {
        local_24 = 2;
      }
      else if (((bVar1 & 0xa8) == 0) && (((bVar1 & 0x10) == 0 || ((bVar1 & 0x40) == 0)))) {
        if ((bVar1 & 7) == 0) {
          t_warn(loc);
          local_24 = 0;
        }
        else {
          local_24 = 3;
          if ((bVar1 & 0x50) != 0) {
            local_24 = 4;
          }
        }
      }
      else {
        local_24 = 4;
      }
      break;
    case 1:
      if (((bVar1 & 0x18) == 0) || ((bVar1 & 0xe0) != 0)) {
        if (((bVar1 & 0xc0) == 0) || ((bVar1 & 0x38) != 0)) {
          if (((bVar1 & 0x20) == 0) && (((bVar1 & 0x18) == 0 || ((bVar1 & 0xc0) == 0)))) {
            if (((bVar1 & 7) == 0) || ((bVar1 & 0xf8) != 0)) {
              t_warn(loc);
            }
            local_24 = 0;
          }
          else {
            local_24 = 4;
          }
        }
        else {
          local_24 = 2;
        }
      }
      else {
        local_24 = 1;
      }
      break;
    case 2:
      if (((bVar1 & 0x30) == 0) || ((bVar1 & 0xcf) != 0)) {
        if (((bVar1 & 0x87) == 0) || ((bVar1 & 0x38) != 0)) {
          if (((bVar1 & 0x40) == 0) || ((bVar1 & 0xbf) != 0)) {
            local_24 = 4;
          }
          else {
            local_24 = 0;
          }
        }
        else {
          local_24 = 3;
        }
      }
      else {
        local_24 = 1;
      }
      break;
    case 3:
      if (((bVar1 & 0x60) == 0) || ((bVar1 & 0x9f) != 0)) {
        if (((bVar1 & 0xf) == 0) || ((bVar1 & 0xe0) != 0)) {
          if (((bVar1 & 0x10) == 0) || ((bVar1 & 0xef) != 0)) {
            local_24 = 4;
          }
          else {
            local_24 = 0;
          }
        }
        else {
          local_24 = 3;
        }
      }
      else {
        local_24 = 2;
      }
      break;
    default:
      impossible("wall_angle: unknown T wall mode %d",(ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      local_24 = 0;
    }
    local_28 = (*(int (*) [5])_idx)[local_24];
    break;
  default:
    impossible("wall_angle: unexpected wall type %d",(ulong)(uint)(int)loc->typ);
    local_28 = 1;
    break;
  case '\x0f':
    if ((*(uint *)&loc->field_0x6 >> 9 & 1) == 0) goto switchD_0018de72_caseD_1;
LAB_0018e21d:
    uVar2 = *(uint *)&loc->field_0x6 >> 4 & 7;
    if (uVar2 == 0) {
      local_28 = 1;
      if (bVar1 != 0) {
        local_28 = 3;
      }
    }
    else if (uVar2 == 1) {
      local_28 = 1;
      if ((bVar1 & 0xf8) != 0) {
        local_28 = 3;
      }
    }
    else if (uVar2 == 2) {
      local_28 = 1;
      if ((bVar1 & 0x8f) != 0) {
        local_28 = 3;
      }
    }
    else {
      impossible("wall_angle: unknown hwall mode %d",(ulong)(*(uint *)&loc->field_0x6 >> 4 & 7));
      local_28 = 1;
    }
  }
  return local_28;
}

Assistant:

static int wall_angle(struct rm *loc)
{
    unsigned int seenv = loc->seenv & 0xff;
    const int *row;
    int col, idx;

#define only(sv, bits)	(((sv) & (bits)) && ! ((sv) & ~(bits)))
    switch (loc->typ) {
	case TUWALL:
		row = wall_matrix[T_u];
		seenv = (seenv >> 4 | seenv << 4) & 0xff;/* rotate to tdwall */
		goto do_twall;
	case TLWALL:
		row = wall_matrix[T_l];
		seenv = (seenv >> 2 | seenv << 6) & 0xff;/* rotate to tdwall */
		goto do_twall;
	case TRWALL:
		row = wall_matrix[T_r];
		seenv = (seenv >> 6 | seenv << 2) & 0xff;/* rotate to tdwall */
		goto do_twall;
	case TDWALL:
		row = wall_matrix[T_d];
do_twall:
		switch (loc->wall_info & WM_MASK) {
		    case 0:
			if (seenv == SV4) {
			    col = T_tlcorn;
			} else if (seenv == SV6) {
			    col = T_trcorn;
			} else if (seenv & (SV3|SV5|SV7) ||
					    ((seenv & SV4) && (seenv & SV6))) {
			    col = T_tdwall;
			} else if (seenv & (SV0|SV1|SV2)) {
			    col = (seenv & (SV4|SV6) ? T_tdwall : T_hwall);
			} else {
			    t_warn(loc);
			    col = T_stone;
			}
			break;
		    case WM_T_LONG:
			if (seenv & (SV3|SV4) && !(seenv & (SV5|SV6|SV7))) {
			    col = T_tlcorn;
			} else if (seenv&(SV6|SV7) && !(seenv&(SV3|SV4|SV5))) {
			    col = T_trcorn;
			} else if ((seenv & SV5) ||
				((seenv & (SV3|SV4)) && (seenv & (SV6|SV7)))) {
			    col = T_tdwall;
			} else {
			    /* only SV0|SV1|SV2 */
			    if (! only(seenv, SV0|SV1|SV2) )
				t_warn(loc);
			    col = T_stone;
			}
			break;
		    case WM_T_BL:
			if (only(seenv, SV4|SV5))
			    col = T_tlcorn;
			else if ((seenv & (SV0|SV1|SV2|SV7)) &&
					!(seenv & (SV3|SV4|SV5)))
			    col = T_hwall;
			else if (only(seenv, SV6))
			    col = T_stone;
			else
			    col = T_tdwall;
			break;
		    case WM_T_BR:
			if (only(seenv, SV5|SV6))
			    col = T_trcorn;
			else if ((seenv & (SV0|SV1|SV2|SV3)) &&
					!(seenv & (SV5|SV6|SV7)))
			    col = T_hwall;
			else if (only(seenv, SV4))
			    col = T_stone;
			else
			    col = T_tdwall;

			break;
		    default:
			impossible("wall_angle: unknown T wall mode %d",
				loc->wall_info & WM_MASK);
			col = T_stone;
			break;
		}
		idx = row[col];
		break;

	case SDOOR:
		if (loc->horizontal) goto horiz;
		/* fall through */
	case VWALL:
		switch (loc->wall_info & WM_MASK) {
		    case 0: idx = seenv ? S_vwall : S_stone; break;
		    case 1: idx = seenv & (SV1|SV2|SV3|SV4|SV5) ? S_vwall :
								  S_stone;
			    break;
		    case 2: idx = seenv & (SV0|SV1|SV5|SV6|SV7) ? S_vwall :
								  S_stone;
			    break;
		    default:
			impossible("wall_angle: unknown vwall mode %d",
				loc->wall_info & WM_MASK);
			idx = S_stone;
			break;
		}
		break;

	case HWALL:
horiz:
		switch (loc->wall_info & WM_MASK) {
		    case 0: idx = seenv ? S_hwall : S_stone; break;
		    case 1: idx = seenv & (SV3|SV4|SV5|SV6|SV7) ? S_hwall :
								  S_stone;
			    break;
		    case 2: idx = seenv & (SV0|SV1|SV2|SV3|SV7) ? S_hwall :
								  S_stone;
			    break;
		    default:
			impossible("wall_angle: unknown hwall mode %d",
				loc->wall_info & WM_MASK);
			idx = S_stone;
			break;
		}
		break;

#define set_corner(idx, loc, which, outer, inner, name)	\
    switch ((loc)->wall_info & WM_MASK) {				    \
	case 0:		 idx = which; break;				    \
	case WM_C_OUTER: idx = seenv &  (outer) ? which : S_stone; break;   \
	case WM_C_INNER: idx = seenv & ~(inner) ? which : S_stone; break;   \
	default:							    \
	    impossible("wall_angle: unknown %s mode %d", name,		    \
		(loc)->wall_info & WM_MASK);				    \
	    idx = S_stone;						    \
	    break;							    \
    }

	case TLCORNER:
	    set_corner(idx, loc, S_tlcorn, (SV3|SV4|SV5), SV4, "tlcorn");
	    break;
	case TRCORNER:
	    set_corner(idx, loc, S_trcorn, (SV5|SV6|SV7), SV6, "trcorn");
	    break;
	case BLCORNER:
	    set_corner(idx, loc, S_blcorn, (SV1|SV2|SV3), SV2, "blcorn");
	    break;
	case BRCORNER:
	    set_corner(idx, loc, S_brcorn, (SV7|SV0|SV1), SV0, "brcorn");
	    break;


	case CROSSWALL:
		switch (loc->wall_info & WM_MASK) {
		    case 0:
			if (seenv == SV0)
			    idx = S_brcorn;
			else if (seenv == SV2)
			    idx = S_blcorn;
			else if (seenv == SV4)
			    idx = S_tlcorn;
			else if (seenv == SV6)
			    idx = S_trcorn;
			else if (!(seenv & ~(SV0|SV1|SV2)) &&
					(seenv & SV1 || seenv == (SV0|SV2)))
			    idx = S_tuwall;
			else if (!(seenv & ~(SV2|SV3|SV4)) &&
					(seenv & SV3 || seenv == (SV2|SV4)))
			    idx = S_trwall;
			else if (!(seenv & ~(SV4|SV5|SV6)) &&
					(seenv & SV5 || seenv == (SV4|SV6)))
			    idx = S_tdwall;
			else if (!(seenv & ~(SV0|SV6|SV7)) &&
					(seenv & SV7 || seenv == (SV0|SV6)))
			    idx = S_tlwall;
			else
			    idx = S_crwall;
			break;

		    case WM_X_TL:
			row = cross_matrix[C_tl];
			seenv = (seenv >> 4 | seenv << 4) & 0xff;
			goto do_crwall;
		    case WM_X_TR:
			row = cross_matrix[C_tr];
			seenv = (seenv >> 6 | seenv << 2) & 0xff;
			goto do_crwall;
		    case WM_X_BL:
			row = cross_matrix[C_bl];
			seenv = (seenv >> 2 | seenv << 6) & 0xff;
			goto do_crwall;
		    case WM_X_BR:
			row = cross_matrix[C_br];
do_crwall:
			if (seenv == SV4)
			    idx = S_stone;
			else {
			    seenv = seenv & ~SV4;	/* strip SV4 */
			    if (seenv == SV0) {
				col = C_brcorn;
			    } else if (seenv & (SV2|SV3)) {
				if (seenv & (SV5|SV6|SV7))
				    col = C_crwall;
				else if (seenv & (SV0|SV1))
				    col = C_tuwall;
				else
				    col = C_blcorn;
			    } else if (seenv & (SV5|SV6)) {
				if (seenv & (SV1|SV2|SV3))
				    col = C_crwall;
				else if (seenv & (SV0|SV7))
				    col = C_tlwall;
				else
				    col = C_trcorn;
			    } else if (seenv & SV1) {
				col = seenv & SV7 ? C_crwall : C_tuwall;
			    } else if (seenv & SV7) {
				col = seenv & SV1 ? C_crwall : C_tlwall;
			    } else {
				impossible(
				    "wall_angle: bottom of crwall check");
				col = C_crwall;
			    }

			    idx = row[col];
			}
			break;

		    case WM_X_TLBR:
			if ( only(seenv, SV1|SV2|SV3) )
			    idx = S_blcorn;
			else if ( only(seenv, SV5|SV6|SV7) )
			    idx = S_trcorn;
			else if ( only(seenv, SV0|SV4) )
			    idx = S_stone;
			else
			    idx = S_crwall;
			break;

		    case WM_X_BLTR:
			if ( only(seenv, SV0|SV1|SV7) )
			    idx = S_brcorn;
			else if ( only(seenv, SV3|SV4|SV5) )
			    idx = S_tlcorn;
			else if ( only(seenv, SV2|SV6) )
			    idx = S_stone;
			else
			    idx = S_crwall;
			break;

		    default:
			impossible("wall_angle: unknown crosswall mode");
			idx = S_stone;
			break;
		}
		break;

	default:
	    impossible("wall_angle: unexpected wall type %d", loc->typ);
	    idx = S_stone;
    }
    return idx;
}